

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

void units::reduce_number_length(string *unit_string,char detect)

{
  char cVar1;
  pointer pcVar2;
  int iVar3;
  size_type sVar4;
  ulong uVar5;
  long lVar6;
  size_t length;
  char *pcVar7;
  ulong uVar8;
  ulong __pos;
  ulong uVar9;
  pointer pcVar10;
  long lVar11;
  ulong uVar12;
  string *psVar13;
  ulong uVar14;
  
  if ((reduce_number_length(std::__cxx11::string&,char)::zstring_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&reduce_number_length(std::__cxx11::string&,char)::
                                   zstring_abi_cxx11_), iVar3 != 0)) {
    reduce_number_length(std::__cxx11::string&,char)::zstring_abi_cxx11_._M_dataplus._M_p =
         (pointer)&reduce_number_length(std::__cxx11::string&,char)::zstring_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&reduce_number_length(std::__cxx11::string&,char)::zstring_abi_cxx11_,
               "00000","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &reduce_number_length(std::__cxx11::string&,char)::zstring_abi_cxx11_,&__dso_handle
                );
    __cxa_guard_release(&reduce_number_length(std::__cxx11::string&,char)::zstring_abi_cxx11_);
  }
  if ((reduce_number_length(std::__cxx11::string&,char)::nstring_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&reduce_number_length(std::__cxx11::string&,char)::
                                   nstring_abi_cxx11_), iVar3 != 0)) {
    reduce_number_length(std::__cxx11::string&,char)::nstring_abi_cxx11_._M_dataplus._M_p =
         (pointer)&reduce_number_length(std::__cxx11::string&,char)::nstring_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&reduce_number_length(std::__cxx11::string&,char)::nstring_abi_cxx11_,
               "99999","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &reduce_number_length(std::__cxx11::string&,char)::nstring_abi_cxx11_,&__dso_handle
                );
    __cxa_guard_release(&reduce_number_length(std::__cxx11::string&,char)::nstring_abi_cxx11_);
  }
  psVar13 = &reduce_number_length(std::__cxx11::string&,char)::nstring_abi_cxx11_;
  if (detect == '0') {
    psVar13 = &reduce_number_length(std::__cxx11::string&,char)::zstring_abi_cxx11_;
  }
  pcVar7 = (psVar13->_M_dataplus)._M_p;
  sVar4 = psVar13->_M_string_length;
  __pos = 0;
LAB_003a474d:
  sVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     unit_string,pcVar7,__pos,sVar4);
  if (sVar4 == 0xffffffffffffffff) {
    return;
  }
  uVar5 = unit_string->_M_string_length;
  uVar14 = sVar4;
  if (sVar4 + 5 < uVar5) {
    pcVar2 = (unit_string->_M_dataplus)._M_p;
    pcVar10 = pcVar2 + 6;
    lVar6 = 5;
    lVar11 = -6;
    do {
      cVar1 = pcVar10[sVar4 - 1];
      if (cVar1 != detect) {
        __pos = sVar4 - lVar11;
        if (__pos != 0) {
          if (cVar1 == '.') goto LAB_003a485c;
          if ((byte)(cVar1 - 0x30U) < 10) {
            if ((uVar5 <= __pos) || (uVar8 = __pos, (byte)(pcVar10[sVar4] - 0x30U) < 10))
            goto LAB_003a485c;
          }
          else {
            uVar8 = lVar6 + sVar4;
          }
          uVar9 = uVar5 - 1;
          if (sVar4 < uVar5 - 1) {
            uVar5 = sVar4 + 1;
            uVar9 = sVar4;
          }
          goto LAB_003a48ab;
        }
        break;
      }
      lVar6 = lVar6 + 1;
      lVar11 = lVar11 + -1;
      pcVar10 = pcVar10 + 1;
    } while ((sVar4 - uVar5) + lVar6 != 0);
  }
  __pos = sVar4 + 5;
  if (detect != '9') {
    if (uVar5 == 0) {
      __pos = 0;
      goto LAB_003a485c;
    }
    pcVar10 = (unit_string->_M_dataplus)._M_p;
    uVar8 = uVar5;
    if (sVar4 < uVar5 - 1) {
      uVar8 = sVar4 + 1;
    }
    do {
      uVar9 = uVar8;
      uVar8 = uVar9 - 1;
      __pos = uVar5;
      if (uVar9 == 0) goto LAB_003a485c;
    } while (pcVar10[uVar9 - 1] != '.');
    if (uVar8 - sVar4 != -1) {
      do {
        uVar14 = sVar4 + 1;
        if (sVar4 <= uVar9) goto LAB_003a4820;
        pcVar7 = pcVar10 + uVar9;
        uVar9 = uVar9 + 1;
      } while ((byte)(*pcVar7 - 0x30U) < 10);
      goto LAB_003a485c;
    }
    sVar4 = sVar4 - 1;
    do {
      do {
        uVar5 = uVar8;
        uVar8 = 0;
      } while (uVar5 == 0);
      if (9 < (byte)(pcVar10[uVar5 - 1] - 0x30U)) goto LAB_003a485c;
      uVar8 = uVar5 - 1;
    } while (pcVar10[uVar5 - 1] == '0');
LAB_003a4820:
    length = ~sVar4;
    goto LAB_003a4826;
  }
  goto LAB_003a485c;
  while (pcVar2[uVar12 - 1] != '.') {
LAB_003a48ab:
    uVar12 = uVar5;
    uVar9 = uVar9 - 1;
    uVar5 = uVar12 - 1;
    if (uVar12 == 0) goto LAB_003a485c;
  }
  if (0xc < uVar8 - uVar5) {
    if (uVar5 - sVar4 == -1) {
      sVar4 = sVar4 - 1;
      do {
        if ((uVar9 == 0xffffffffffffffff) || (pcVar7 = pcVar2 + uVar9, 9 < (byte)(*pcVar7 - 0x30U)))
        goto LAB_003a485c;
        uVar9 = uVar9 - 1;
      } while (*pcVar7 == '0');
LAB_003a490a:
      length = uVar8 - sVar4;
LAB_003a4826:
      shorten_number(unit_string,sVar4,length);
      __pos = uVar14;
    }
    else {
      do {
        uVar14 = sVar4 + 1;
        if (sVar4 <= uVar12) goto LAB_003a490a;
        pcVar7 = pcVar2 + uVar12;
        uVar12 = uVar12 + 1;
      } while ((byte)(*pcVar7 - 0x30U) < 10);
    }
  }
LAB_003a485c:
  pcVar7 = (psVar13->_M_dataplus)._M_p;
  sVar4 = psVar13->_M_string_length;
  goto LAB_003a474d;
}

Assistant:

static void reduce_number_length(std::string& unit_string, char detect)
{
    static const std::string zstring("00000");
    static const std::string nstring("99999");
    const std::string& detseq(detect == '0' ? zstring : nstring);
    // search for a bunch of zeros in a row
    std::size_t indexingloc{0};

    auto zloc = unit_string.find(detseq);
    while (zloc != std::string::npos) {
        auto nloc = unit_string.find_first_not_of(detect, zloc + 5);
        indexingloc = zloc + 5;
        if (nloc != std::string::npos) {
            indexingloc = nloc + 1;
            if (unit_string[nloc] != '.') {
                if (!isDigitCharacter(unit_string[nloc]) ||
                    (unit_string.size() > nloc + 1 &&
                     !isDigitCharacter(unit_string[nloc + 1]))) {
                    if (isDigitCharacter(unit_string[nloc])) {
                        ++nloc;
                    }

                    auto dloc = unit_string.find_last_of('.', zloc);

                    if (dloc != std::string::npos && nloc - dloc > 12) {
                        bool valid = true;
                        if (dloc == zloc - 1) {
                            --zloc;
                            auto ploc = dloc;
                            valid = false;
                            while (true) {
                                if (ploc <= 0) {
                                    break;
                                }
                                --ploc;
                                if (!isDigitCharacter(unit_string[ploc])) {
                                    break;
                                }
                                if (unit_string[ploc] != '0') {
                                    valid = true;
                                    break;
                                }
                            }
                        } else {
                            auto ploc = dloc + 1;
                            while (ploc < zloc) {
                                if (!isDigitCharacter(unit_string[ploc])) {
                                    valid = false;
                                    break;
                                }
                                ++ploc;
                            }
                        }
                        if (valid) {
                            shorten_number(unit_string, zloc, nloc - zloc);
                            indexingloc = zloc + 1;
                        }
                    }
                }
            }
        } else if (detect != '9') {
            indexingloc = unit_string.size();
            auto dloc = unit_string.find_last_of('.', zloc);

            if (dloc != std::string::npos) {
                bool valid = true;
                if (dloc == zloc - 1) {
                    --zloc;
                    auto ploc = dloc;
                    valid = false;
                    while (true) {
                        if (ploc > 0) {
                            --ploc;
                            if (!isDigitCharacter(unit_string[ploc])) {
                                break;
                            }
                            if (unit_string[ploc] != '0') {
                                valid = true;
                                break;
                            }
                        }
                    }
                } else {
                    auto ploc = dloc + 1;
                    while (ploc < zloc) {
                        if (!isDigitCharacter(unit_string[ploc])) {
                            valid = false;
                            break;
                        }
                        ++ploc;
                    }
                }
                if (valid) {
                    shorten_number(unit_string, zloc, nloc - zloc);
                    indexingloc = zloc + 1;
                }
            }
        }
        zloc = unit_string.find(detseq, indexingloc);
    }
}